

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

uint32 __thiscall
Clasp::mt::SharedLitsClause::isOpen(SharedLitsClause *this,Solver *s,TypeSet *x,LitVec *freeLits)

{
  bool bVar1;
  byte bVar2;
  Type t;
  Literal *pLVar3;
  ClauseHead *in_RDX;
  Solver *in_RSI;
  Solver *in_RDI;
  Literal *end;
  Literal *r;
  ValueRep v;
  Literal *head;
  uint in_stack_ffffffffffffff9c;
  SharedLiterals *in_stack_ffffffffffffffa0;
  Solver *this_00;
  Solver *x_00;
  Literal *local_40;
  Type local_4;
  
  t = ClauseHead::type((ClauseHead *)0x22f151);
  bVar1 = Constraint_t::Set::inSet((Set *)in_RDX,t);
  if ((!bVar1) || (bVar1 = ClauseHead::satisfied(in_RDX,in_RDI), bVar1)) {
    local_4 = Static;
  }
  else {
    x_00 = in_RDI;
    local_40 = SharedLiterals::begin((SharedLiterals *)(in_RDI->model).ebo_.buf);
    pLVar3 = SharedLiterals::end(in_stack_ffffffffffffffa0);
    for (; local_40 != pLVar3; local_40 = local_40 + 1) {
      this_00 = in_RSI;
      Literal::var(local_40);
      bVar2 = Solver::value(this_00,in_stack_ffffffffffffff9c);
      if (bVar2 == 0) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)in_RDX,
                   (Literal *)x_00);
      }
      else {
        in_stack_ffffffffffffff9c = (uint)bVar2;
        bVar2 = trueValue((Literal *)0x22f21a);
        if (in_stack_ffffffffffffff9c == bVar2) {
          *(uint32 *)&(in_RDI->lower).field_0x4 = local_40->rep_;
          return 0;
        }
      }
    }
    local_4 = ClauseHead::type((ClauseHead *)0x22f261);
  }
  return local_4;
}

Assistant:

uint32 SharedLitsClause::isOpen(const Solver& s, const TypeSet& x, LitVec& freeLits) {
	if (!x.inSet(ClauseHead::type()) || ClauseHead::satisfied(s)) {
		return 0;
	}
	Literal* head = head_;
	ValueRep v;
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		if ( (v = s.value(r->var())) == value_free ) {
			freeLits.push_back(*r);
		}
		else if (v == trueValue(*r)) {
			head[2] = *r; // remember as cache literal
			return 0;
		}
	}
	return ClauseHead::type();
}